

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

Optional<Corrade::Containers::String> * Corrade::Utility::Path::homeDirectory(void)

{
  char *data;
  Optional<Corrade::Containers::String> *in_RDI;
  Error EStack_38;
  
  data = getenv("HOME");
  if (data == (char *)0x0) {
    Error::Error(&EStack_38,(Flags)0x0);
    Debug::operator<<(&EStack_38.super_Debug,"Utility::Path::homeDirectory(): $HOME not available");
    Error::~Error(&EStack_38);
    in_RDI->_set = false;
  }
  else {
    Containers::String::String
              ((String *)&EStack_38,(nullptr_t)0x0,(nullptr_t)0x0,(nullptr_t)0x0,data);
    in_RDI->_set = true;
    Containers::String::String((String *)in_RDI,(String *)&EStack_38);
    Containers::String::~String((String *)&EStack_38);
  }
  return in_RDI;
}

Assistant:

Containers::Optional<Containers::String> homeDirectory() {
    /* Unix, Emscripten */
    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    const char* const h = std::getenv("HOME");
    if(!h) {
        Error{} << "Utility::Path::homeDirectory(): $HOME not available";
        return {};
    }

    return Containers::String{h};

    /* Windows (not Store/Phone) */
    #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
    wchar_t* h = nullptr;
    Containers::ScopeGuard guard{h,
        #ifdef CORRADE_MSVC2015_COMPATIBILITY
        /* MSVC 2015 is unable to cast the parameter for CoTaskMemFree */
        [](wchar_t* path){ CoTaskMemFree(path); }
        #else
        CoTaskMemFree
        #endif
    };
    /* There doesn't seem to be any possibility how this could fail, so just
       assert */
    CORRADE_INTERNAL_ASSERT(SHGetKnownFolderPath(FOLDERID_Documents, KF_FLAG_DEFAULT, nullptr, &h) == S_OK);
    return fromNativeSeparators(Unicode::narrow(h));

    /* Other */
    #else
    Error{} << "Utility::Path::homeDirectory(): not implemented on this platform";
    return {};
    #endif
}